

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstats.cpp
# Opt level: O1

void __thiscall
kernel::CCoinsStats::CCoinsStats(CCoinsStats *this,int block_height,uint256 *block_hash)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  uint256 *puVar7;
  base_blob<256U> *pbVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->nHeight = block_height;
  uVar6 = *(undefined8 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 8);
  uVar2 = *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x10);
  uVar3 = *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x14);
  uVar4 = *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x18);
  uVar5 = *(undefined4 *)((block_hash->super_base_blob<256U>).m_data._M_elems + 0x1c);
  *(undefined8 *)(this->hashBlock).super_base_blob<256U>.m_data._M_elems =
       *(undefined8 *)(block_hash->super_base_blob<256U>).m_data._M_elems;
  *(undefined8 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 8) = uVar6;
  *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x10) = uVar2;
  *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x14) = uVar3;
  *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar4;
  *(undefined4 *)((this->hashBlock).super_base_blob<256U>.m_data._M_elems + 0x1c) = uVar5;
  this->nTransactions = 0;
  this->nTransactionOutputs = 0;
  this->nBogoSize = 0;
  puVar7 = &this->hashSerialized;
  (puVar7->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar7->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  pbVar8 = &(this->hashSerialized).super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[8] = '\0';
  (pbVar8->m_data)._M_elems[9] = '\0';
  (pbVar8->m_data)._M_elems[10] = '\0';
  (pbVar8->m_data)._M_elems[0xb] = '\0';
  (pbVar8->m_data)._M_elems[0xc] = '\0';
  (pbVar8->m_data)._M_elems[0xd] = '\0';
  (pbVar8->m_data)._M_elems[0xe] = '\0';
  (pbVar8->m_data)._M_elems[0xf] = '\0';
  pbVar8 = &(this->hashSerialized).super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0x10] = '\0';
  (pbVar8->m_data)._M_elems[0x11] = '\0';
  (pbVar8->m_data)._M_elems[0x12] = '\0';
  (pbVar8->m_data)._M_elems[0x13] = '\0';
  (pbVar8->m_data)._M_elems[0x14] = '\0';
  (pbVar8->m_data)._M_elems[0x15] = '\0';
  (pbVar8->m_data)._M_elems[0x16] = '\0';
  (pbVar8->m_data)._M_elems[0x17] = '\0';
  pbVar8 = &(this->hashSerialized).super_base_blob<256U>;
  (pbVar8->m_data)._M_elems[0x18] = '\0';
  (pbVar8->m_data)._M_elems[0x19] = '\0';
  (pbVar8->m_data)._M_elems[0x1a] = '\0';
  (pbVar8->m_data)._M_elems[0x1b] = '\0';
  (pbVar8->m_data)._M_elems[0x1c] = '\0';
  (pbVar8->m_data)._M_elems[0x1d] = '\0';
  (pbVar8->m_data)._M_elems[0x1e] = '\0';
  (pbVar8->m_data)._M_elems[0x1f] = '\0';
  this->nDiskSize = 0;
  (this->total_amount).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value = 0;
  (this->total_amount).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = true;
  this->coins_count = 0;
  this->index_used = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    this->total_unspendables_bip30 = 0;
    this->total_unspendables_scripts = 0;
    this->total_coinbase_amount = 0;
    this->total_unspendables_genesis_block = 0;
    this->total_prevout_spent_amount = 0;
    this->total_new_outputs_ex_coinbase_amount = 0;
    this->total_subsidy = 0;
    this->total_unspendable_amount = 0;
    this->total_unspendables_unclaimed_rewards = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CCoinsStats::CCoinsStats(int block_height, const uint256& block_hash)
    : nHeight(block_height),
      hashBlock(block_hash) {}